

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O3

QStringList * __thiscall
QCommandLineParser::positionalArguments
          (QStringList *__return_storage_ptr__,QCommandLineParser *this)

{
  Data *pDVar1;
  QCommandLineParserPrivate *pQVar2;
  long in_FS_OFFSET;
  QMessageLogger local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = this->d;
  if (pQVar2->needsParsing == true) {
    local_38.context.version = 2;
    local_38.context._4_8_ = 0;
    local_38.context._12_8_ = 0;
    local_38.context.function._4_4_ = 0;
    local_38.context.category = "default";
    QMessageLogger::warning
              (&local_38,"QCommandLineParser: call process() or parse() before %s",
               "positionalArguments");
    pQVar2 = this->d;
  }
  pDVar1 = (pQVar2->positionalArgumentList).d.d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (pQVar2->positionalArgumentList).d.ptr;
  (__return_storage_ptr__->d).size = (pQVar2->positionalArgumentList).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QCommandLineParser::positionalArguments() const
{
    d->checkParsed("positionalArguments");
    return d->positionalArgumentList;
}